

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.h
# Opt level: O0

Index __thiscall wasm::analysis::CFGBlockIndexes::get(CFGBlockIndexes *this,Expression *expr)

{
  bool bVar1;
  pointer pvVar2;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false> local_30;
  _Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false> local_28;
  const_iterator iter;
  Expression *expr_local;
  CFGBlockIndexes *this_local;
  
  iter.super__Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>._M_cur =
       (_Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>)
       (_Node_iterator_base<std::pair<wasm::Expression_*const,_unsigned_int>,_false>)expr;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
       ::find((unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
               *)this,(key_type *)&iter);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
       ::end((unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
              *)this);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (bVar1) {
    this_local._4_4_ = 0xffffffff;
  }
  else {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<wasm::Expression_*const,_unsigned_int>,_false,_false>
                         *)&local_28);
    this_local._4_4_ = pvVar2->second;
  }
  return this_local._4_4_;
}

Assistant:

Index get(Expression* expr) const {
    auto iter = map.find(expr);
    if (iter == map.end()) {
      // There is no entry for this, which can be the case for control flow
      // structures, or for unreachable code.
      return InvalidBlock;
    }
    return iter->second;
  }